

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

float64 vector_dist_eucl(float32 *v1,float32 *v2,int32 len)

{
  int local_2c;
  double dStack_28;
  int32 i;
  float64 d;
  int32 len_local;
  float32 *v2_local;
  float32 *v1_local;
  
  dStack_28 = 0.0;
  for (local_2c = 0; local_2c < len; local_2c = local_2c + 1) {
    dStack_28 = (double)(((float)v1[local_2c] - (float)v2[local_2c]) *
                        ((float)v1[local_2c] - (float)v2[local_2c])) + dStack_28;
  }
  return (float64)dStack_28;
}

Assistant:

float64
vector_dist_eucl(float32 * v1, float32 * v2, int32 len)
{
    float64 d;
    int32 i;

    d = 0.0;
    for (i = 0; i < len; i++)
        d += (v1[i] - v2[i]) * (v1[i] - v2[i]);

    return d;
}